

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3AppendToNode(Blob *pNode,Blob *pPrev,char *zTerm,int nTerm,char *aDoclist,int nDoclist)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  char *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  Blob *in_R8;
  int in_R9D;
  int nSuffix;
  int nPrefix;
  int bFirst;
  int rc;
  undefined4 in_stack_ffffffffffffffc0;
  
  uVar1 = (uint)(*(int *)(in_RSI + 1) == 0);
  blobGrowBuffer(in_R8,in_R9D,
                 (int *)(ulong)CONCAT14(*(int *)(in_RSI + 1) == 0,in_stack_ffffffffffffffc0));
  iVar2 = fts3PrefixCompress((char *)*in_RSI,*(int *)(in_RSI + 1),in_RDX,in_ECX);
  iVar3 = in_ECX - iVar2;
  memcpy((void *)*in_RSI,in_RDX,(long)in_ECX);
  *(int *)(in_RSI + 1) = in_ECX;
  if (uVar1 == 0) {
    iVar4 = sqlite3Fts3PutVarint((char *)(*in_RDI + (long)(int)in_RDI[1]),(long)iVar2);
    *(int *)(in_RDI + 1) = iVar4 + (int)in_RDI[1];
  }
  iVar4 = sqlite3Fts3PutVarint((char *)(*in_RDI + (long)(int)in_RDI[1]),(long)iVar3);
  *(int *)(in_RDI + 1) = iVar4 + (int)in_RDI[1];
  memcpy((void *)(*in_RDI + (long)(int)in_RDI[1]),in_RDX + iVar2,(long)iVar3);
  *(int *)(in_RDI + 1) = iVar3 + (int)in_RDI[1];
  if (in_R8 != (Blob *)0x0) {
    iVar2 = sqlite3Fts3PutVarint((char *)(*in_RDI + (long)(int)in_RDI[1]),(long)in_R9D);
    *(int *)(in_RDI + 1) = iVar2 + (int)in_RDI[1];
    memcpy((void *)(*in_RDI + (long)(int)in_RDI[1]),in_R8,(long)in_R9D);
    *(int *)(in_RDI + 1) = in_R9D + (int)in_RDI[1];
  }
  return 0;
}

Assistant:

static int fts3AppendToNode(
  Blob *pNode,                    /* Current node image to append to */
  Blob *pPrev,                    /* Buffer containing previous term written */
  const char *zTerm,              /* New term to write */
  int nTerm,                      /* Size of zTerm in bytes */
  const char *aDoclist,           /* Doclist (or NULL) to write */
  int nDoclist                    /* Size of aDoclist in bytes */ 
){
  int rc = SQLITE_OK;             /* Return code */
  int bFirst = (pPrev->n==0);     /* True if this is the first term written */
  int nPrefix;                    /* Size of term prefix in bytes */
  int nSuffix;                    /* Size of term suffix in bytes */

  /* Node must have already been started. There must be a doclist for a
  ** leaf node, and there must not be a doclist for an internal node.  */
  assert( pNode->n>0 );
  assert( (pNode->a[0]=='\0')==(aDoclist!=0) );

  blobGrowBuffer(pPrev, nTerm, &rc);
  if( rc!=SQLITE_OK ) return rc;

  nPrefix = fts3PrefixCompress(pPrev->a, pPrev->n, zTerm, nTerm);
  nSuffix = nTerm - nPrefix;
  memcpy(pPrev->a, zTerm, nTerm);
  pPrev->n = nTerm;

  if( bFirst==0 ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nPrefix);
  }
  pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nSuffix);
  memcpy(&pNode->a[pNode->n], &zTerm[nPrefix], nSuffix);
  pNode->n += nSuffix;

  if( aDoclist ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nDoclist);
    memcpy(&pNode->a[pNode->n], aDoclist, nDoclist);
    pNode->n += nDoclist;
  }

  assert( pNode->n<=pNode->nAlloc );

  return SQLITE_OK;
}